

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O0

void __thiscall
slang::analysis::AnalysisManager::AnalysisManager(AnalysisManager *this,AnalysisOptions options)

{
  size_t sVar1;
  undefined4 in_EDX;
  size_t in_RSI;
  concurrent_flat_map<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *in_RDI;
  size_t i;
  size_t in_stack_ffffffffffffff88;
  thread_pool<(unsigned_char)__x00_> *in_stack_ffffffffffffff90;
  AnalysisManager *__args;
  size_ctrl_type *this_00;
  size_ctrl_type *__n;
  vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
  *in_stack_ffffffffffffffc0;
  ulong uVar2;
  ulong uVar3;
  
  *(undefined4 *)
   &(in_RDI->table_).
    super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
    .arrays.
    super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
    .groups_size_mask = in_EDX;
  (in_RDI->table_).
  super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  .arrays.
  super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  .groups_size_index = in_RSI;
  std::
  vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
  ::vector((vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
            *)0x9a20db);
  __n = &(in_RDI->table_).
         super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
         .size_ctrl;
  boost::unordered::
  concurrent_flat_map<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  ::concurrent_flat_map(in_RDI);
  this_00 = &in_RDI[1].table_.
             super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             .size_ctrl;
  BS::thread_pool<(unsigned_char)'\x00'>::thread_pool
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::mutex::mutex((mutex *)0x9a211f);
  std::__exception_ptr::exception_ptr::exception_ptr
            ((exception_ptr *)(in_RDI[1].table_.mutexes.mutexes.buf + 0xf8));
  __args = (AnalysisManager *)
           &(in_RDI->table_).
            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            .arrays.
            super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            .groups_;
  BS::thread_pool<(unsigned_char)'\x00'>::get_thread_count
            ((thread_pool<(unsigned_char)__x00_> *)
             &in_RDI[1].table_.
              super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              .size_ctrl);
  std::
  vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
  ::reserve(in_stack_ffffffffffffffc0,(size_type)__n);
  uVar2 = 0;
  while( true ) {
    uVar3 = uVar2;
    sVar1 = BS::thread_pool<(unsigned_char)'\x00'>::get_thread_count
                      ((thread_pool<(unsigned_char)__x00_> *)
                       &in_RDI[1].table_.
                        super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                        .size_ctrl);
    if (sVar1 + 1 <= uVar2) break;
    std::
    vector<slang::analysis::AnalysisManager::WorkerState,std::allocator<slang::analysis::AnalysisManager::WorkerState>>
    ::emplace_back<slang::analysis::AnalysisManager&>
              ((vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
                *)this_00,__args);
    uVar2 = uVar3 + 1;
  }
  return;
}

Assistant:

AnalysisManager::AnalysisManager(AnalysisOptions options) :
    options(options), threadPool(options.numThreads) {

    workerStates.reserve(threadPool.get_thread_count() + 1);
    for (size_t i = 0; i < threadPool.get_thread_count() + 1; i++)
        workerStates.emplace_back(*this);
}